

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O1

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string_view a,string_view b)

{
  int iVar1;
  NameEquality NVar2;
  Nullable<const_char_*> src;
  size_t n;
  size_type __rlen;
  bool bVar3;
  string result;
  Nonnull<char_*> local_78;
  size_t local_70;
  char local_68;
  undefined7 uStack_67;
  Nonnull<char_*> local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  Nullable<const_char_*> local_38;
  
  src = b._M_str;
  n = a._M_len;
  local_70 = 0;
  local_68 = '\0';
  local_78 = &local_68;
  std::__cxx11::string::resize((ulong)&local_78,(char)a._M_len);
  absl::lts_20250127::ascii_internal::AsciiStrToUpper(local_78,a._M_str,n);
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  std::__cxx11::string::resize((ulong)&local_58,(char)b._M_len);
  absl::lts_20250127::ascii_internal::AsciiStrToUpper(local_58,src,b._M_len);
  local_38 = src;
  if (local_70 == local_50) {
    if (local_70 == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(local_78,local_58,local_70);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  NVar2 = NO_MATCH;
  if ((bVar3) && (NVar2 = EQUAL_IGNORE_CASE, n == b._M_len)) {
    if (n == 0) {
      NVar2 = EXACT_EQUAL;
    }
    else {
      iVar1 = bcmp(a._M_str,local_38,n);
      NVar2 = EQUAL_IGNORE_CASE - (iVar1 == 0);
    }
  }
  return NVar2;
}

Assistant:

NameEquality CheckNameEquality(absl::string_view a, absl::string_view b) {
  if (absl::AsciiStrToUpper(a) == absl::AsciiStrToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}